

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

void luaT_trybinTM(lua_State *L,TValue *p1,TValue *p2,StkId res,TMS event)

{
  int iVar1;
  TMS event_local;
  StkId res_local;
  TValue *p2_local;
  TValue *p1_local;
  lua_State *L_local;
  
  iVar1 = callbinTM(L,p1,p2,res,event);
  if (-1 < iVar1) {
    return;
  }
  if ((4 < event - TM_BAND) && (event != TM_BNOT)) {
    luaG_opinterror(L,p1,p2,"perform arithmetic on");
  }
  if (((p1->tt_ & 0xf) == 3) && ((p2->tt_ & 0xf) == 3)) {
    luaG_tointerror(L,p1,p2);
  }
  luaG_opinterror(L,p1,p2,"perform bitwise operation on");
}

Assistant:

void luaT_trybinTM (lua_State *L, const TValue *p1, const TValue *p2,
                    StkId res, TMS event) {
  if (l_unlikely(callbinTM(L, p1, p2, res, event) < 0)) {
    switch (event) {
      case TM_BAND: case TM_BOR: case TM_BXOR:
      case TM_SHL: case TM_SHR: case TM_BNOT: {
        if (ttisnumber(p1) && ttisnumber(p2))
          luaG_tointerror(L, p1, p2);
        else
          luaG_opinterror(L, p1, p2, "perform bitwise operation on");
      }
      /* calls never return, but to avoid warnings: *//* FALLTHROUGH */
      default:
        luaG_opinterror(L, p1, p2, "perform arithmetic on");
    }
  }
}